

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

int is_last_day_in_month(int year,int month,int day)

{
  int *piVar1;
  
  piVar1 = days_in_a_month_l;
  if (year % 100 == 0) {
    piVar1 = days_in_a_month;
  }
  if ((year & 3U) != 0) {
    piVar1 = days_in_a_month;
  }
  return (int)(piVar1[(long)month + -1] == day);
}

Assistant:

int
is_last_day_in_month(int year,int month,int day){
    int * days;
    if(LEAP(year))
      days = days_in_a_month_l;
    else
      days = days_in_a_month;
    if(day ==  days[month-1]) return 1;
    return 0;
}